

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void BailOutRecord::CheckPreemptiveRejit
               (FunctionBody *executeFunction,BailOutKind bailOutKind,BailOutRecord *bailoutRecord,
               uint8 *callsOrIterationsCount,int loopNumber)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  undefined4 uVar5;
  
  uVar5 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((bailOutKind == BailOutOnNoProfile) &&
     (bVar1 = executeFunction->bailOnMisingProfileCount + 1,
     executeFunction->bailOnMisingProfileCount = bVar1, DAT_01430318 < (int)(uint)bVar1)) {
    executeFunction->bailOnMisingProfileCount = '\0';
  }
  else {
    if ((int)(uint)bailoutRecord->bailOutCount <= (int)DAT_0144d968) {
      return;
    }
    if (BailOutFailedCtorGuardCheck < bailOutKind) {
      return;
    }
    if ((0x20f180d00U >> ((ulong)bailOutKind & 0x3f) & 1) == 0) {
      return;
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,ReJITPhase);
    if (loopNumber == -1) {
      if ((!bVar2) ||
         ((DAT_0145c3e0 != DAT_0145c3e8 &&
          (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c3c0,bailOutKind), !bVar2))))
      goto LAB_003e7b70;
      iVar3 = (*(executeFunction->super_ParseableFunctionInfo).super_FunctionProxy.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7]
              )(executeFunction);
      pcVar4 = GetBailOutKindName(bailOutKind);
      Output::Print(L"Force rejit as RejitMaxBailoOutCount reached for a bailout record: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d RejitMaxBailoutCount: %d\r\n"
                    ,CONCAT44(extraout_var_00,iVar3),pcVar4,(ulong)bailoutRecord->bailOutCount,
                    (ulong)*callsOrIterationsCount,(ulong)DAT_0144d968);
    }
    else {
      if ((!bVar2) ||
         ((DAT_0145c3e0 != DAT_0145c3e8 &&
          (bVar2 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c3c0,bailOutKind), !bVar2))))
      goto LAB_003e7b70;
      iVar3 = (*(executeFunction->super_ParseableFunctionInfo).super_FunctionProxy.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7]
              )(executeFunction);
      pcVar4 = GetBailOutKindName(bailOutKind);
      Output::Print(L"Force rejit as RejitMaxBailoOutCount reached for a bailout record: function: %s, loopNumber: %d, bailOutKindName: (%S), bailOutCount: %d, callCount: %d RejitMaxBailoutCount: %d\r\n"
                    ,CONCAT44(extraout_var,iVar3),(ulong)(uint)loopNumber,pcVar4,
                    (ulong)bailoutRecord->bailOutCount,(ulong)*callsOrIterationsCount,
                    CONCAT44(uVar5,DAT_0144d968));
    }
    Output::Flush();
  }
LAB_003e7b70:
  bailoutRecord->bailOutCount = 0;
  *callsOrIterationsCount = '\0';
  return;
}

Assistant:

void BailOutRecord::CheckPreemptiveRejit(Js::FunctionBody* executeFunction, IR::BailOutKind bailOutKind, BailOutRecord* bailoutRecord, uint8& callsOrIterationsCount, int loopNumber)
{
    if (bailOutKind == IR::BailOutOnNoProfile && executeFunction->IncrementBailOnMisingProfileCount() > CONFIG_FLAG(BailOnNoProfileLimit))
    {
        // A rejit here should improve code quality, so lets avoid too many unnecessary bailouts.
        executeFunction->ResetBailOnMisingProfileCount();
        bailoutRecord->bailOutCount = 0;
        callsOrIterationsCount = 0;
    }
    else if (bailoutRecord->bailOutCount > CONFIG_FLAG(RejitMaxBailOutCount))
    {
        switch (bailOutKind)
        {
        case IR::BailOutOnPolymorphicInlineFunction:
        case IR::BailOutOnFailedPolymorphicInlineTypeCheck:
        case IR::BailOutFailedInlineTypeCheck:
        case IR::BailOutOnInlineFunction:
        case IR::BailOutFailedTypeCheck:
        case IR::BailOutFailedFixedFieldTypeCheck:
        case IR::BailOutFailedCtorGuardCheck:
        case IR::BailOutFailedFixedFieldCheck:
        case IR::BailOutFailedEquivalentTypeCheck:
        case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
        {
            // If we consistently see RejitMaxBailOutCount bailouts for these kinds, then likely we have stale profile data and it is beneficial to rejit.
            // Note you need to include only bailout kinds which don't disable the entire optimizations.
            if (loopNumber == -1)
            {
                REJIT_KIND_TESTTRACE(bailOutKind, _u("Force rejit as RejitMaxBailoOutCount reached for a bailout record: function: %s, bailOutKindName: (%S), bailOutCount: %d, callCount: %d RejitMaxBailoutCount: %d\r\n"),
                    executeFunction->GetDisplayName(), ::GetBailOutKindName(bailOutKind), bailoutRecord->bailOutCount, callsOrIterationsCount, CONFIG_FLAG(RejitMaxBailOutCount));
            }
            else
            {
                REJIT_KIND_TESTTRACE(bailOutKind, _u("Force rejit as RejitMaxBailoOutCount reached for a bailout record: function: %s, loopNumber: %d, bailOutKindName: (%S), bailOutCount: %d, callCount: %d RejitMaxBailoutCount: %d\r\n"),
                    executeFunction->GetDisplayName(), loopNumber, ::GetBailOutKindName(bailOutKind), bailoutRecord->bailOutCount, callsOrIterationsCount, CONFIG_FLAG(RejitMaxBailOutCount));
            }
            bailoutRecord->bailOutCount = 0;
            callsOrIterationsCount = 0;
            break;
        }
        default: break;
        }
    }
}